

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

bool duckdb::Date::ParseDoubleDigit(char *buf,idx_t len,idx_t *pos,int32_t *result)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  
  uVar3 = *pos;
  if ((uVar3 < len) && ((byte)(buf[uVar3] - 0x30U) < 10)) {
    uVar1 = uVar3 + 1;
    *pos = uVar1;
    cVar2 = buf[uVar3];
    *result = cVar2 + -0x30;
    if ((uVar1 < len) && ((byte)(buf[uVar1] - 0x30U) < 10)) {
      *pos = uVar3 + 2;
      *result = (int)buf[uVar3 + 1] + (cVar2 + -0x30) * 10 + -0x30;
    }
    return true;
  }
  return false;
}

Assistant:

bool Date::ParseDoubleDigit(const char *buf, idx_t len, idx_t &pos, int32_t &result) {
	if (pos < len && StringUtil::CharacterIsDigit(buf[pos])) {
		result = buf[pos++] - '0';
		if (pos < len && StringUtil::CharacterIsDigit(buf[pos])) {
			result = (buf[pos++] - '0') + result * 10;
		}
		return true;
	}
	return false;
}